

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O0

void __thiscall QAbstractItemModel::endMoveRows(QAbstractItemModel *this)

{
  long lVar1;
  QAbstractItemModelPrivate *pQVar2;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int numMoved;
  QAbstractItemModelPrivate *d;
  QModelIndex adjustedDestination;
  QModelIndex adjustedSource;
  Change removeChange;
  Change insertChange;
  undefined4 uVar3;
  QStack<QAbstractItemModelPrivate::Change> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  QModelIndex *pQVar4;
  QAbstractItemModel *in_stack_ffffffffffffff10;
  QModelIndex *pQVar5;
  int destinationChild;
  QModelIndex *destinationParent;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QModelIndex *in_stack_ffffffffffffff50;
  QAbstractItemModelPrivate *in_stack_ffffffffffffff58;
  QModelIndex local_88;
  QModelIndex local_70;
  QModelIndex local_58;
  undefined4 local_40;
  undefined4 local_3c;
  byte local_38;
  Orientation in_stack_ffffffffffffffd0;
  undefined4 local_18;
  byte local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  destinationParent = in_RDI;
  pQVar2 = d_func((QAbstractItemModel *)0x7f4da0);
  destinationChild = (int)((ulong)pQVar2 >> 0x20);
  memset(&stack0xffffffffffffffd0,0xaa,0x28);
  QStack<QAbstractItemModelPrivate::Change>::pop(in_stack_ffffffffffffff00);
  memset(&local_58,0xaa,0x28);
  QStack<QAbstractItemModelPrivate::Change>::pop(in_stack_ffffffffffffff00);
  local_70.r = local_58.r;
  local_70.c = local_58.c;
  local_70.i = local_58.i;
  local_70.m.ptr = local_58.m.ptr;
  if ((local_10 & 1) != 0) {
    QModelIndex::row(&local_88);
    QModelIndex::column(&local_88);
    QModelIndex::internalPointer(&local_88);
    createIndex(in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                (int)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  }
  if ((local_38 & 1) != 0) {
    QModelIndex::row(&local_70);
    QModelIndex::column(&local_70);
    QModelIndex::internalPointer(&local_70);
    createIndex(in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                (int)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    local_70.c = in_stack_ffffffffffffff4c;
    local_70.r = in_stack_ffffffffffffff48;
    local_70.i = (quintptr)in_stack_ffffffffffffff50;
    local_70.m.ptr = (QAbstractItemModel *)in_stack_ffffffffffffff58;
  }
  uVar3 = 2;
  pQVar4 = &local_70;
  pQVar5 = &local_88;
  QAbstractItemModelPrivate::itemsMoved
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff48,destinationParent,destinationChild,in_stack_ffffffffffffffd0)
  ;
  rowsMoved((QAbstractItemModel *)in_RDI,pQVar4,local_40,local_3c,pQVar5,local_18,uVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModel::endMoveRows()
{
    Q_D(QAbstractItemModel);

    QAbstractItemModelPrivate::Change insertChange = d->changes.pop();
    QAbstractItemModelPrivate::Change removeChange = d->changes.pop();

    QModelIndex adjustedSource = removeChange.parent;
    QModelIndex adjustedDestination = insertChange.parent;

    const int numMoved = removeChange.last - removeChange.first + 1;
    if (insertChange.needsAdjust)
      adjustedDestination = createIndex(adjustedDestination.row() - numMoved, adjustedDestination.column(), adjustedDestination.internalPointer());

    if (removeChange.needsAdjust)
      adjustedSource = createIndex(adjustedSource.row() + numMoved, adjustedSource.column(), adjustedSource.internalPointer());

    d->itemsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, Qt::Vertical);

    emit rowsMoved(adjustedSource, removeChange.first, removeChange.last, adjustedDestination, insertChange.first, QPrivateSignal());
}